

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int encode_list(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,uint32_t count,
               AMQP_VALUE *items)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG p_Stack_38;
  uint32_t size;
  LOGGER_LOG l;
  AMQP_VALUE *ppAStack_28;
  int result;
  AMQP_VALUE *items_local;
  void *pvStack_18;
  uint32_t count_local;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  ppAStack_28 = items;
  items_local._4_4_ = count;
  pvStack_18 = context;
  context_local = encoder_output;
  if (count == 0) {
    iVar1 = output_byte(encoder_output,context,'E');
    if (iVar1 == 0) {
      l._4_4_ = 0;
    }
    else {
      p_Stack_38 = xlogging_get_log_function();
      if (p_Stack_38 != (LOGGER_LOG)0x0) {
        (*p_Stack_38)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                      ,"encode_list",0xf1b,1,"Could not output list constructor byte");
      }
      l._4_4_ = 0xf1c;
    }
  }
  else {
    iVar1 = amqpvalue_get_encoded_list_size(items,count,(uint32_t *)((long)&l_1 + 4));
    if (iVar1 == 0) {
      if ((items_local._4_4_ < 0x100) && (l_1._4_4_ < 0xff)) {
        iVar1 = encode_list_constructor((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_18,true);
        if ((iVar1 == 0) &&
           (iVar1 = encode_list_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_18,
                                      items_local._4_4_,l_1._4_4_,ppAStack_28,true), iVar1 == 0)) {
          l._4_4_ = 0;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                      ,"encode_list",0xf36,1,"Failed encoding small list");
          }
          l._4_4_ = 0xf37;
        }
      }
      else {
        iVar1 = encode_list_constructor((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_18,false);
        if ((iVar1 == 0) &&
           (iVar1 = encode_list_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_18,
                                      items_local._4_4_,l_1._4_4_,ppAStack_28,false), iVar1 == 0)) {
          l._4_4_ = 0;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                      ,"encode_list",0xf46,1,"Failed encoding large list");
          }
          l._4_4_ = 0xf47;
        }
      }
    }
    else {
      l._4_4_ = 0xf2b;
    }
  }
  return l._4_4_;
}

Assistant:

static int encode_list(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, uint32_t count, AMQP_VALUE* items)
{
    int result;

    if (count == 0)
    {
        /* Codes_SRS_AMQPVALUE_01_303: [<encoding name="list0" code="0x45" category="fixed" width="0" label="the empty list (i.e. the list with no elements)"/>] */
        if (output_byte(encoder_output, context, 0x45) != 0)
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Could not output list constructor byte");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }
    else
    {
        uint32_t size;

        if (amqpvalue_get_encoded_list_size(items, count, &size) != 0)
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            result = MU_FAILURE;
        }
        else
        {
            if ((count <= 255) && (size < 255))
            {
                /* Codes_SRS_AMQPVALUE_01_304: [<encoding name="list8" code="0xc0" category="compound" width="1" label="up to 2^8 - 1 list elements with total size less than 2^8 octets"/>] */
                if ((encode_list_constructor(encoder_output, context, true) != 0) ||
                    (encode_list_value(encoder_output, context, count, size, items, true) != 0))
                {
                    /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
                    LogError("Failed encoding small list");
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
                    result = 0;
                }
            }
            else
            {
                /* Codes_SRS_AMQPVALUE_01_305: [<encoding name="list32" code="0xd0" category="compound" width="4" label="up to 2^32 - 1 list elements with total size less than 2^32 octets"/>] */
                if ((encode_list_constructor(encoder_output, context, false) != 0) ||
                    (encode_list_value(encoder_output, context, count, size, items, false) != 0))
                {
                    /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
                    LogError("Failed encoding large list");
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
                    result = 0;
                }
            }
        }
    }

    return result;
}